

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Renderer_conflict FT_Lookup_Renderer(FT_Library library,FT_Glyph_Format format,FT_ListNode *node)

{
  FT_Renderer_conflict pFVar1;
  FT_Renderer_conflict renderer;
  FT_Renderer_conflict result;
  FT_ListNode cur;
  FT_ListNode *node_local;
  FT_Glyph_Format format_local;
  FT_Library library_local;
  
  if (library != (FT_Library)0x0) {
    result = (FT_Renderer_conflict)(library->renderers).head;
    if (node != (FT_ListNode *)0x0) {
      if (*node != (FT_ListNode)0x0) {
        result = (FT_Renderer_conflict)(*node)->next;
      }
      *node = (FT_ListNode)0x0;
    }
    for (; result != (FT_Renderer_conflict)0x0;
        result = (FT_Renderer_conflict)(result->root).library) {
      pFVar1 = (FT_Renderer_conflict)(result->root).memory;
      if (pFVar1->glyph_format == format) {
        if (node == (FT_ListNode *)0x0) {
          return pFVar1;
        }
        *node = (FT_ListNode)result;
        return pFVar1;
      }
    }
  }
  return (FT_Renderer_conflict)0x0;
}

Assistant:

FT_BASE_DEF( FT_Renderer )
  FT_Lookup_Renderer( FT_Library       library,
                      FT_Glyph_Format  format,
                      FT_ListNode*     node )
  {
    FT_ListNode  cur;
    FT_Renderer  result = NULL;


    if ( !library )
      goto Exit;

    cur = library->renderers.head;

    if ( node )
    {
      if ( *node )
        cur = (*node)->next;
      *node = NULL;
    }

    while ( cur )
    {
      FT_Renderer  renderer = FT_RENDERER( cur->data );


      if ( renderer->glyph_format == format )
      {
        if ( node )
          *node = cur;

        result = renderer;
        break;
      }
      cur = cur->next;
    }

  Exit:
    return result;
  }